

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeField
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  int *piVar1;
  uint *puVar2;
  long *plVar3;
  ulong *puVar4;
  double dVar5;
  bool bVar6;
  uint uVar7;
  int32_t iVar8;
  CppStringType CVar9;
  uint32_t uVar10;
  int iVar11;
  int iVar12;
  MapFieldBase *this;
  uint8_t *puVar13;
  RepeatedField<double> *rhs;
  int64_t iVar14;
  uint64_t uVar15;
  EnumValueDescriptor *pEVar16;
  MessageLite *pMVar17;
  string *s;
  string *psVar18;
  RepeatedField<int> *pRVar19;
  RepeatedField<unsigned_int> *pRVar20;
  RepeatedField<long> *pRVar21;
  size_t sVar22;
  RepeatedField<float> *rhs_00;
  RepeatedField<unsigned_long> *pRVar23;
  RepeatedField<bool> *rhs_01;
  const_pointer piVar24;
  const_pointer puVar25;
  const_pointer plVar26;
  byte *pbVar27;
  ulong uVar28;
  const_pointer data;
  const_pointer puVar29;
  ulong *puVar30;
  const_pointer data_00;
  const_pointer puVar31;
  unsigned_long uVar32;
  const_pointer data_01;
  Reflection *this_00;
  uint uVar33;
  pointer __src;
  char *in_R9;
  undefined4 uVar34;
  float value;
  undefined4 uVar35;
  Metadata MVar36;
  string_view field_name;
  anon_class_24_3_10f69874 get_message_from_field;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapKey local_d8;
  MapValueConstRef local_b0;
  MessageFactory *local_a0;
  string *local_98;
  uint local_8c;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  map_entries;
  MapKey local_68;
  
  MVar36 = Message::GetMetadata(message);
  this_00 = MVar36.reflection;
  if (((((field->field_0x1 & 8) != 0) &&
       ((field->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
      (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) &&
     (bVar6 = FieldDescriptor::is_repeated(field), !bVar6)) {
    puVar13 = InternalSerializeMessageSetItem(field,message,target,stream);
    return puVar13;
  }
  bVar6 = FieldDescriptor::is_map(field);
  if (bVar6) {
    this = Reflection::GetMapData(this_00,message,field);
    bVar6 = MapFieldBase::IsMapValid(this);
    if (bVar6) {
      if (stream->is_serialization_deterministic_ == true) {
        MapKeySorter::SortKey(&sorted_key_list,message,this_00,field);
        for (; sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            sorted_key_list.
            super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 sorted_key_list.
                 super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          map_entries.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          map_entries.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((ulong)map_entries.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
          Reflection::LookupMapValue
                    (this_00,message,field,
                     sorted_key_list.
                     super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                     ._M_impl.super__Vector_impl_data._M_start,(MapValueConstRef *)&map_entries);
          target = InternalSerializeMapEntry
                             (field,sorted_key_list.
                                    super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                              (MapValueConstRef *)&map_entries,target,stream);
        }
        std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                  (&sorted_key_list);
        return target;
      }
      Reflection::MapBegin((MapIterator *)&sorted_key_list,this_00,message,field);
      while( true ) {
        Reflection::MapEnd((MapIterator *)&map_entries,this_00,message,field);
        bVar6 = protobuf::operator!=((MapIterator *)&sorted_key_list,(MapIterator *)&map_entries);
        MapKey::~MapKey(&local_68);
        if (!bVar6) break;
        target = InternalSerializeMapEntry(field,&local_d8,&local_b0,target,stream);
        MapIterator::operator++((MapIterator *)&sorted_key_list);
      }
      MapKey::~MapKey(&local_d8);
      return target;
    }
  }
  bVar6 = FieldDescriptor::is_repeated(field);
  if (bVar6) {
    uVar7 = Reflection::FieldSize(this_00,message,field);
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((1 < (int)uVar7) && (bVar6 = FieldDescriptor::is_map(field), bVar6)) &&
       (stream->is_serialization_deterministic_ == true)) {
      DynamicMapSorter::Sort
                ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  *)&sorted_key_list,message,uVar7,this_00,field);
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::_M_move_assign(&map_entries,
                       (_Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                        *)&sorted_key_list);
      std::
      _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::~_Vector_base((_Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       *)&sorted_key_list);
    }
  }
  else {
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar6 = Reflection::HasField(this_00,message,field);
      uVar7 = (uint)bVar6;
    }
    else {
      uVar7 = 1;
    }
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  bVar6 = FieldDescriptor::is_packed(field);
  if (!bVar6) {
    get_message_from_field.map_entries = &map_entries;
    uVar33 = 0;
    get_message_from_field.message = message;
    get_message_from_field.message_reflection = this_00;
    local_8c = uVar7;
    if ((int)uVar7 < 1) {
      local_8c = 0;
    }
    for (; uVar33 != local_8c; uVar33 = uVar33 + 1) {
      target = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      switch(field->type_) {
      case '\x01':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          dVar5 = Reflection::GetRepeatedDouble(this_00,message,field,uVar33);
          uVar34 = SUB84(dVar5,0);
          uVar35 = (undefined4)((ulong)dVar5 >> 0x20);
        }
        else {
          dVar5 = Reflection::GetDouble(this_00,message,field);
          uVar34 = SUB84(dVar5,0);
          uVar35 = (undefined4)((ulong)dVar5 >> 0x20);
        }
        target = WireFormatLite::WriteDoubleToArray
                           (field->number_,(double)CONCAT44(uVar35,uVar34),target);
        break;
      case '\x02':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          value = Reflection::GetRepeatedFloat(this_00,message,field,uVar33);
        }
        else {
          value = Reflection::GetFloat(this_00,message,field);
        }
        target = WireFormatLite::WriteFloatToArray(field->number_,value,target);
        break;
      case '\x03':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          iVar14 = Reflection::GetRepeatedInt64(this_00,message,field,uVar33);
        }
        else {
          iVar14 = Reflection::GetInt64(this_00,message,field);
        }
        target = WireFormatLite::WriteInt64ToArray(field->number_,iVar14,target);
        break;
      case '\x04':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          uVar15 = Reflection::GetRepeatedUInt64(this_00,message,field,uVar33);
        }
        else {
          uVar15 = Reflection::GetUInt64(this_00,message,field);
        }
        target = WireFormatLite::WriteUInt64ToArray(field->number_,uVar15,target);
        break;
      case '\x05':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          iVar8 = Reflection::GetRepeatedInt32(this_00,message,field,uVar33);
        }
        else {
          iVar8 = Reflection::GetInt32(this_00,message,field);
        }
        target = WireFormatLite::WriteInt32ToArray(field->number_,iVar8,target);
        break;
      case '\x06':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          uVar15 = Reflection::GetRepeatedUInt64(this_00,message,field,uVar33);
        }
        else {
          uVar15 = Reflection::GetUInt64(this_00,message,field);
        }
        target = WireFormatLite::WriteFixed64ToArray(field->number_,uVar15,target);
        break;
      case '\a':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          uVar10 = Reflection::GetRepeatedUInt32(this_00,message,field,uVar33);
        }
        else {
          uVar10 = Reflection::GetUInt32(this_00,message,field);
        }
        target = WireFormatLite::WriteFixed32ToArray(field->number_,uVar10,target);
        break;
      case '\b':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          bVar6 = Reflection::GetRepeatedBool(this_00,message,field,uVar33);
        }
        else {
          bVar6 = Reflection::GetBool(this_00,message,field);
        }
        target = WireFormatLite::WriteBoolToArray(field->number_,bVar6,target);
        break;
      case '\t':
        FieldDescriptor::requires_utf8_validation(field);
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)&sorted_key_list.
                       super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          s = Reflection::GetRepeatedStringReference
                        (this_00,message,field,uVar33,(string *)&sorted_key_list);
        }
        else {
          s = Reflection::GetStringReference(this_00,message,field,(string *)&sorted_key_list);
        }
        field_name._M_str = in_R9;
        field_name._M_len = (size_t)field->all_names_[1]._M_dataplus._M_p;
        WireFormatLite::VerifyUtf8String
                  ((WireFormatLite *)(s->_M_dataplus)._M_p,(char *)(ulong)(uint)s->_M_string_length,
                   1,(Operation)field->all_names_[1]._M_string_length,field_name);
        uVar10 = field->number_;
        psVar18 = (string *)s->_M_string_length;
        if ((long)psVar18 < 0x80) {
          local_a0 = (MessageFactory *)stream->end_;
          uVar7 = uVar10 * 8;
          local_98 = s;
          iVar12 = io::EpsCopyOutputStream::TagSize(uVar7);
          s = local_98;
          if ((long)psVar18 <=
              (long)((long)&local_a0[2]._vptr_MessageFactory + ~(ulong)(target + iVar12))) {
            pbVar27 = target + 2;
            for (uVar7 = uVar7 | 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
              pbVar27[-2] = (byte)uVar7 | 0x80;
              pbVar27 = pbVar27 + 1;
            }
            pbVar27[-2] = (byte)uVar7;
            pbVar27[-1] = (byte)psVar18;
            __src = (local_98->_M_dataplus)._M_p;
LAB_002ede47:
            memcpy(pbVar27,__src,(size_t)psVar18);
            target = pbVar27 + (long)psVar18;
            goto LAB_002ede5a;
          }
        }
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,uVar10,s,target);
LAB_002ede5a:
        std::__cxx11::string::~string((string *)&sorted_key_list);
        break;
      case '\n':
        pMVar17 = &InternalSerializeField::anon_class_24_3_10f69874::operator()
                             (&get_message_from_field,field,uVar33)->super_MessageLite;
        target = WireFormatLite::InternalWriteGroup(field->number_,pMVar17,target,stream);
        break;
      case '\v':
        pMVar17 = &InternalSerializeField::anon_class_24_3_10f69874::operator()
                             (&get_message_from_field,field,uVar33)->super_MessageLite;
        iVar12 = field->number_;
        iVar11 = MessageLite::GetCachedSize(pMVar17);
        target = WireFormatLite::InternalWriteMessage(iVar12,pMVar17,iVar11,target,stream);
        break;
      case '\f':
        CVar9 = FieldDescriptor::cpp_string_type(field);
        if (CVar9 != kCord) {
          sorted_key_list.
          super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)&sorted_key_list.
                         super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          sorted_key_list.
          super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          sorted_key_list.
          super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          bVar6 = FieldDescriptor::is_repeated(field);
          if (bVar6) {
            psVar18 = Reflection::GetRepeatedStringReference
                                (this_00,message,field,uVar33,(string *)&sorted_key_list);
          }
          else {
            psVar18 = Reflection::GetStringReference
                                (this_00,message,field,(string *)&sorted_key_list);
          }
          uVar10 = field->number_;
          if ((long)psVar18->_M_string_length < 0x80) {
            local_a0 = (MessageFactory *)stream->end_;
            uVar7 = uVar10 * 8;
            local_98 = (string *)psVar18->_M_string_length;
            iVar12 = io::EpsCopyOutputStream::TagSize(uVar7);
            if ((long)local_98 <=
                (long)((long)&local_a0[2]._vptr_MessageFactory + ~(ulong)(target + iVar12))) {
              pbVar27 = target + 2;
              for (uVar7 = uVar7 | 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
                pbVar27[-2] = (byte)uVar7 | 0x80;
                pbVar27 = pbVar27 + 1;
              }
              pbVar27[-2] = (byte)uVar7;
              pbVar27[-1] = (byte)local_98;
              __src = (psVar18->_M_dataplus)._M_p;
              psVar18 = local_98;
              goto LAB_002ede47;
            }
          }
          target = io::EpsCopyOutputStream::WriteStringOutline(stream,uVar10,psVar18,target);
          goto LAB_002ede5a;
        }
        Reflection::GetCord((Reflection *)&sorted_key_list,(Message *)this_00,
                            (FieldDescriptor *)message);
        target = io::EpsCopyOutputStream::WriteString
                           (stream,field->number_,(Cord *)&sorted_key_list,target);
        absl::lts_20240722::Cord::~Cord((Cord *)&sorted_key_list);
        break;
      case '\r':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          uVar10 = Reflection::GetRepeatedUInt32(this_00,message,field,uVar33);
        }
        else {
          uVar10 = Reflection::GetUInt32(this_00,message,field);
        }
        target = WireFormatLite::WriteUInt32ToArray(field->number_,uVar10,target);
        break;
      case '\x0e':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          pEVar16 = Reflection::GetRepeatedEnum(this_00,message,field,uVar33);
        }
        else {
          pEVar16 = Reflection::GetEnum(this_00,message,field);
        }
        target = WireFormatLite::WriteEnumToArray(field->number_,pEVar16->number_,target);
        break;
      case '\x0f':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          iVar8 = Reflection::GetRepeatedInt32(this_00,message,field,uVar33);
        }
        else {
          iVar8 = Reflection::GetInt32(this_00,message,field);
        }
        target = WireFormatLite::WriteSFixed32ToArray(field->number_,iVar8,target);
        break;
      case '\x10':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          iVar14 = Reflection::GetRepeatedInt64(this_00,message,field,uVar33);
        }
        else {
          iVar14 = Reflection::GetInt64(this_00,message,field);
        }
        target = WireFormatLite::WriteSFixed64ToArray(field->number_,iVar14,target);
        break;
      case '\x11':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          iVar8 = Reflection::GetRepeatedInt32(this_00,message,field,uVar33);
        }
        else {
          iVar8 = Reflection::GetInt32(this_00,message,field);
        }
        target = WireFormatLite::WriteSInt32ToArray(field->number_,iVar8,target);
        break;
      case '\x12':
        bVar6 = FieldDescriptor::is_repeated(field);
        if (bVar6) {
          iVar14 = Reflection::GetRepeatedInt64(this_00,message,field,uVar33);
        }
        else {
          iVar14 = Reflection::GetInt64(this_00,message,field);
        }
        target = WireFormatLite::WriteSInt64ToArray(field->number_,iVar14,target);
      }
    }
    goto LAB_002eea81;
  }
  if (uVar7 == 0) goto LAB_002eea81;
  puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  switch(field->type_) {
  case '\x01':
    rhs = Reflection::GetRepeatedFieldInternal<double>(this_00,message,field);
    RepeatedField<double>::RepeatedField((RepeatedField<double> *)&get_message_from_field,rhs);
    iVar12 = field->number_;
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    iVar11 = RepeatedField<double>::size((RepeatedField<double> *)&get_message_from_field);
    if (puVar13 < stream->end_) {
      puVar13 = puVar13 + 2;
      for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        puVar13[-2] = (byte)uVar7 | 0x80;
        puVar13 = puVar13 + 1;
      }
      puVar13[-2] = (byte)uVar7;
      for (uVar7 = iVar11 << 3; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        puVar13[-1] = (byte)uVar7 | 0x80;
        puVar13 = puVar13 + 1;
      }
      puVar13[-1] = (byte)uVar7;
      data_01 = RepeatedField<double>::data((RepeatedField<double> *)&get_message_from_field);
      target = io::EpsCopyOutputStream::WriteRaw(stream,data_01,iVar11 << 3,puVar13);
      RepeatedField<double>::~RepeatedField((RepeatedField<double> *)&get_message_from_field);
      goto LAB_002eea81;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sorted_key_list,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
               ,0x355,10,"ptr < end_");
    goto LAB_002eec9b;
  case '\x02':
    rhs_00 = Reflection::GetRepeatedFieldInternal<float>(this_00,message,field);
    RepeatedField<float>::RepeatedField((RepeatedField<float> *)&get_message_from_field,rhs_00);
    iVar12 = field->number_;
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    iVar11 = RepeatedField<float>::size((RepeatedField<float> *)&get_message_from_field);
    if (puVar13 < stream->end_) {
      puVar13 = puVar13 + 2;
      for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        puVar13[-2] = (byte)uVar7 | 0x80;
        puVar13 = puVar13 + 1;
      }
      puVar13[-2] = (byte)uVar7;
      for (uVar7 = iVar11 << 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        puVar13[-1] = (byte)uVar7 | 0x80;
        puVar13 = puVar13 + 1;
      }
      puVar13[-1] = (byte)uVar7;
      data = RepeatedField<float>::data((RepeatedField<float> *)&get_message_from_field);
      target = io::EpsCopyOutputStream::WriteRaw(stream,data,iVar11 << 2,puVar13);
      RepeatedField<float>::~RepeatedField((RepeatedField<float> *)&get_message_from_field);
      goto LAB_002eea81;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sorted_key_list,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
               ,0x355,10,"ptr < end_");
    goto LAB_002eec9b;
  case '\x03':
    pRVar21 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)&get_message_from_field,pRVar21);
    iVar12 = field->number_;
    sVar22 = FieldDataOnlyByteSize(field,message);
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    target = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      target[-2] = (byte)uVar7 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar7;
    while( true ) {
      if ((uint)sVar22 < 0x80) break;
      target[-1] = (byte)sVar22 | 0x80;
      sVar22 = (size_t)((uint)sVar22 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar22;
    puVar30 = (ulong *)RepeatedField<long>::data((RepeatedField<long> *)&get_message_from_field);
    iVar12 = RepeatedField<long>::size((RepeatedField<long> *)&get_message_from_field);
    puVar4 = puVar30 + iVar12;
    do {
      pbVar27 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar28 = *puVar30;
      while( true ) {
        target = pbVar27 + 1;
        if (uVar28 < 0x80) break;
        *pbVar27 = (byte)uVar28 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar27 = target;
      }
      puVar30 = puVar30 + 1;
      *pbVar27 = (byte)uVar28;
    } while (puVar30 < puVar4);
    goto LAB_002ee912;
  case '\x04':
    pRVar23 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this_00,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)&get_message_from_field,pRVar23);
    iVar12 = field->number_;
    sVar22 = FieldDataOnlyByteSize(field,message);
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    target = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      target[-2] = (byte)uVar7 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar7;
    while( true ) {
      if ((uint)sVar22 < 0x80) break;
      target[-1] = (byte)sVar22 | 0x80;
      sVar22 = (size_t)((uint)sVar22 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar22;
    puVar31 = RepeatedField<unsigned_long>::data
                        ((RepeatedField<unsigned_long> *)&get_message_from_field);
    iVar12 = RepeatedField<unsigned_long>::size
                       ((RepeatedField<unsigned_long> *)&get_message_from_field);
    puVar29 = puVar31 + iVar12;
    do {
      pbVar27 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar32 = *puVar31;
      while( true ) {
        target = pbVar27 + 1;
        if (uVar32 < 0x80) break;
        *pbVar27 = (byte)uVar32 | 0x80;
        uVar32 = uVar32 >> 7;
        pbVar27 = target;
      }
      puVar31 = puVar31 + 1;
      *pbVar27 = (byte)uVar32;
    } while (puVar31 < puVar29);
    goto LAB_002ee9e4;
  case '\x05':
    pRVar19 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&get_message_from_field,pRVar19);
    iVar12 = field->number_;
    sVar22 = FieldDataOnlyByteSize(field,message);
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    target = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      target[-2] = (byte)uVar7 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar7;
    while( true ) {
      if ((uint)sVar22 < 0x80) break;
      target[-1] = (byte)sVar22 | 0x80;
      sVar22 = (size_t)((uint)sVar22 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar22;
    piVar24 = RepeatedField<int>::data((RepeatedField<int> *)&get_message_from_field);
    iVar12 = RepeatedField<int>::size((RepeatedField<int> *)&get_message_from_field);
    piVar1 = piVar24 + iVar12;
    do {
      pbVar27 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar28 = (ulong)*piVar24;
      while( true ) {
        target = pbVar27 + 1;
        if (uVar28 < 0x80) break;
        *pbVar27 = (byte)uVar28 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar27 = target;
      }
      piVar24 = piVar24 + 1;
      *pbVar27 = (byte)uVar28;
    } while (piVar24 < piVar1);
    break;
  case '\x06':
    pRVar23 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this_00,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)&get_message_from_field,pRVar23);
    iVar12 = field->number_;
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    iVar11 = RepeatedField<unsigned_long>::size
                       ((RepeatedField<unsigned_long> *)&get_message_from_field);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    puVar13 = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      puVar13[-2] = (byte)uVar7 | 0x80;
      puVar13 = puVar13 + 1;
    }
    puVar13[-2] = (byte)uVar7;
    for (uVar7 = iVar11 << 3; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      puVar13[-1] = (byte)uVar7 | 0x80;
      puVar13 = puVar13 + 1;
    }
    puVar13[-1] = (byte)uVar7;
    puVar29 = RepeatedField<unsigned_long>::data
                        ((RepeatedField<unsigned_long> *)&get_message_from_field);
    target = io::EpsCopyOutputStream::WriteRaw(stream,puVar29,iVar11 << 3,puVar13);
LAB_002ee9e4:
    RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)&get_message_from_field);
    goto LAB_002eea81;
  case '\a':
    pRVar20 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this_00,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)&get_message_from_field,pRVar20);
    iVar12 = field->number_;
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    iVar11 = RepeatedField<unsigned_int>::size
                       ((RepeatedField<unsigned_int> *)&get_message_from_field);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    puVar13 = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      puVar13[-2] = (byte)uVar7 | 0x80;
      puVar13 = puVar13 + 1;
    }
    puVar13[-2] = (byte)uVar7;
    for (uVar7 = iVar11 << 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      puVar13[-1] = (byte)uVar7 | 0x80;
      puVar13 = puVar13 + 1;
    }
    puVar13[-1] = (byte)uVar7;
    puVar25 = RepeatedField<unsigned_int>::data
                        ((RepeatedField<unsigned_int> *)&get_message_from_field);
    target = io::EpsCopyOutputStream::WriteRaw(stream,puVar25,iVar11 << 2,puVar13);
    goto LAB_002eea77;
  case '\b':
    rhs_01 = Reflection::GetRepeatedFieldInternal<bool>(this_00,message,field);
    RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)&get_message_from_field,rhs_01);
    iVar12 = field->number_;
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    uVar7 = RepeatedField<bool>::size((RepeatedField<bool> *)&get_message_from_field);
    if (puVar13 < stream->end_) {
      puVar13 = puVar13 + 2;
      for (uVar33 = iVar12 * 8 + 2; 0x7f < uVar33; uVar33 = uVar33 >> 7) {
        puVar13[-2] = (byte)uVar33 | 0x80;
        puVar13 = puVar13 + 1;
      }
      puVar13[-2] = (byte)uVar33;
      for (uVar33 = uVar7; 0x7f < uVar33; uVar33 = uVar33 >> 7) {
        puVar13[-1] = (byte)uVar33 | 0x80;
        puVar13 = puVar13 + 1;
      }
      puVar13[-1] = (byte)uVar33;
      data_00 = RepeatedField<bool>::data((RepeatedField<bool> *)&get_message_from_field);
      target = io::EpsCopyOutputStream::WriteRaw(stream,data_00,uVar7,puVar13);
      RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)&get_message_from_field);
      goto LAB_002eea81;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sorted_key_list,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
               ,0x355,10,"ptr < end_");
    goto LAB_002eec9b;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sorted_key_list,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/wire_format.cc"
               ,0x539);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)&sorted_key_list,(char (*) [19])"Invalid descriptor");
LAB_002eec9b:
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&sorted_key_list);
  case '\r':
    pRVar20 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this_00,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)&get_message_from_field,pRVar20);
    iVar12 = field->number_;
    sVar22 = FieldDataOnlyByteSize(field,message);
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    target = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      target[-2] = (byte)uVar7 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar7;
    while( true ) {
      if ((uint)sVar22 < 0x80) break;
      target[-1] = (byte)sVar22 | 0x80;
      sVar22 = (size_t)((uint)sVar22 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar22;
    puVar25 = RepeatedField<unsigned_int>::data
                        ((RepeatedField<unsigned_int> *)&get_message_from_field);
    iVar12 = RepeatedField<unsigned_int>::size
                       ((RepeatedField<unsigned_int> *)&get_message_from_field);
    puVar2 = puVar25 + iVar12;
    do {
      pbVar27 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar7 = *puVar25;
      while( true ) {
        target = pbVar27 + 1;
        if (uVar7 < 0x80) break;
        *pbVar27 = (byte)uVar7 | 0x80;
        uVar7 = uVar7 >> 7;
        pbVar27 = target;
      }
      puVar25 = puVar25 + 1;
      *pbVar27 = (byte)uVar7;
    } while (puVar25 < puVar2);
LAB_002eea77:
    RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)&get_message_from_field);
    goto LAB_002eea81;
  case '\x0e':
    pRVar19 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&get_message_from_field,pRVar19);
    iVar12 = field->number_;
    sVar22 = FieldDataOnlyByteSize(field,message);
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    target = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      target[-2] = (byte)uVar7 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar7;
    while( true ) {
      if ((uint)sVar22 < 0x80) break;
      target[-1] = (byte)sVar22 | 0x80;
      sVar22 = (size_t)((uint)sVar22 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar22;
    piVar24 = RepeatedField<int>::data((RepeatedField<int> *)&get_message_from_field);
    iVar12 = RepeatedField<int>::size((RepeatedField<int> *)&get_message_from_field);
    piVar1 = piVar24 + iVar12;
    do {
      pbVar27 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar28 = (ulong)*piVar24;
      while( true ) {
        target = pbVar27 + 1;
        if (uVar28 < 0x80) break;
        *pbVar27 = (byte)uVar28 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar27 = target;
      }
      piVar24 = piVar24 + 1;
      *pbVar27 = (byte)uVar28;
    } while (piVar24 < piVar1);
    break;
  case '\x0f':
    pRVar19 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&get_message_from_field,pRVar19);
    iVar12 = field->number_;
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    iVar11 = RepeatedField<int>::size((RepeatedField<int> *)&get_message_from_field);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    puVar13 = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      puVar13[-2] = (byte)uVar7 | 0x80;
      puVar13 = puVar13 + 1;
    }
    puVar13[-2] = (byte)uVar7;
    for (uVar7 = iVar11 << 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      puVar13[-1] = (byte)uVar7 | 0x80;
      puVar13 = puVar13 + 1;
    }
    puVar13[-1] = (byte)uVar7;
    piVar24 = RepeatedField<int>::data((RepeatedField<int> *)&get_message_from_field);
    target = io::EpsCopyOutputStream::WriteRaw(stream,piVar24,iVar11 << 2,puVar13);
    break;
  case '\x10':
    pRVar21 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)&get_message_from_field,pRVar21);
    iVar12 = field->number_;
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    iVar11 = RepeatedField<long>::size((RepeatedField<long> *)&get_message_from_field);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    puVar13 = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      puVar13[-2] = (byte)uVar7 | 0x80;
      puVar13 = puVar13 + 1;
    }
    puVar13[-2] = (byte)uVar7;
    for (uVar7 = iVar11 << 3; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      puVar13[-1] = (byte)uVar7 | 0x80;
      puVar13 = puVar13 + 1;
    }
    puVar13[-1] = (byte)uVar7;
    plVar26 = RepeatedField<long>::data((RepeatedField<long> *)&get_message_from_field);
    target = io::EpsCopyOutputStream::WriteRaw(stream,plVar26,iVar11 << 3,puVar13);
    goto LAB_002ee912;
  case '\x11':
    pRVar19 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&get_message_from_field,pRVar19);
    iVar12 = field->number_;
    sVar22 = FieldDataOnlyByteSize(field,message);
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    target = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      target[-2] = (byte)uVar7 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar7;
    while( true ) {
      if ((uint)sVar22 < 0x80) break;
      target[-1] = (byte)sVar22 | 0x80;
      sVar22 = (size_t)((uint)sVar22 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar22;
    piVar24 = RepeatedField<int>::data((RepeatedField<int> *)&get_message_from_field);
    iVar12 = RepeatedField<int>::size((RepeatedField<int> *)&get_message_from_field);
    piVar1 = piVar24 + iVar12;
    do {
      pbVar27 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar7 = *piVar24 >> 0x1f ^ *piVar24 * 2;
      while( true ) {
        target = pbVar27 + 1;
        if (uVar7 < 0x80) break;
        *pbVar27 = (byte)uVar7 | 0x80;
        uVar7 = uVar7 >> 7;
        pbVar27 = target;
      }
      piVar24 = piVar24 + 1;
      *pbVar27 = (byte)uVar7;
    } while (piVar24 < piVar1);
    break;
  case '\x12':
    pRVar21 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)&get_message_from_field,pRVar21);
    iVar12 = field->number_;
    sVar22 = FieldDataOnlyByteSize(field,message);
    puVar13 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar13);
    if (stream->end_ <= puVar13) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_002eec9b;
    }
    target = puVar13 + 2;
    for (uVar7 = iVar12 * 8 + 2; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      target[-2] = (byte)uVar7 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar7;
    while( true ) {
      if ((uint)sVar22 < 0x80) break;
      target[-1] = (byte)sVar22 | 0x80;
      sVar22 = (size_t)((uint)sVar22 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar22;
    plVar26 = RepeatedField<long>::data((RepeatedField<long> *)&get_message_from_field);
    iVar12 = RepeatedField<long>::size((RepeatedField<long> *)&get_message_from_field);
    plVar3 = plVar26 + iVar12;
    do {
      pbVar27 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar28 = *plVar26 >> 0x3f ^ *plVar26 * 2;
      while( true ) {
        target = pbVar27 + 1;
        if (uVar28 < 0x80) break;
        *pbVar27 = (byte)uVar28 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar27 = target;
      }
      plVar26 = plVar26 + 1;
      *pbVar27 = (byte)uVar28;
    } while (plVar26 < plVar3);
LAB_002ee912:
    RepeatedField<long>::~RepeatedField((RepeatedField<long> *)&get_message_from_field);
    goto LAB_002eea81;
  }
  RepeatedField<int>::~RepeatedField((RepeatedField<int> *)&get_message_from_field);
LAB_002eea81:
  std::
  _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~_Vector_base(&map_entries.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                 );
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                            const Message& message,
                                            uint8_t* target,
                                            io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }


  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueConstRef map_value;
          message_reflection->LookupMapValue(message, field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                               \
        field->number(), r, FieldDataOnlyByteSize(field, message), target);    \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);             \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        ABSL_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  auto get_message_from_field = [&message, &map_entries, message_reflection](
                                    const FieldDescriptor* field, int j) {
    if (!field->is_repeated()) {
      return &message_reflection->GetMessage(message, field);
    }
    if (!map_entries.empty()) {
      return map_entries[j];
    }
    return &message_reflection->GetRepeatedMessage(message, field, j);
  };
  for (int j = 0; j < count; j++) {
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

      case FieldDescriptor::TYPE_GROUP: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteGroup(field->number(), *msg,
                                                    target, stream);
      } break;

      case FieldDescriptor::TYPE_MESSAGE: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteMessage(
            field->number(), *msg, msg->GetCachedSize(), target, stream);
      } break;

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value = message_reflection->GetCord(message, field);
          target = stream->WriteString(field->number(), value, target);
          break;
        }
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}